

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>
fmt::v8::detail::write<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>
          (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> out,basic_string_view<wchar_t> s,
          basic_format_specs<wchar_t> *specs,locale_ref param_4)

{
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> bVar1;
  ulong uVar2;
  ulong uVar3;
  size_t width;
  anon_class_16_2_3f014a30 local_10;
  
  uVar2 = s.size_;
  local_10.data = s.data_;
  if ((specs->type & ~string) == none) {
    uVar3 = (ulong)specs->precision;
    local_10.size = uVar2;
    if (uVar3 < uVar2) {
      local_10.size = uVar3;
    }
    if ((long)uVar3 < 0) {
      local_10.size = uVar2;
    }
    width = 0;
    if (specs->width != 0) {
      width = local_10.size;
    }
    bVar1 = write_padded<(fmt::v8::align::type)1,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::write<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::basic_string_view<wchar_t>,fmt::v8::basic_format_specs<wchar_t>const&)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_1_>
                      (out,specs,local_10.size,width,&local_10);
    return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)bVar1.container;
  }
  fmt::v8::detail::throw_format_error("invalid type specifier");
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out,
                         basic_string_view<type_identity_t<Char>> s,
                         const basic_format_specs<Char>& specs, locale_ref)
    -> OutputIt {
  check_string_type_spec(specs.type);
  return write(out, s, specs);
}